

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O3

void __thiscall
Board::filter_illegal_moves
          (Board *this,
          map<Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
          *possible_moves,
          map<Point,_std::map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>_>_>_>
          *possible_play_moves,Color color,uint turn)

{
  _Base_ptr *single_play;
  long lVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Base_ptr p_Var3;
  const_iterator __position;
  bool bVar4;
  long lVar5;
  iterator __position_00;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  undefined7 in_register_00000009;
  iterator __result;
  Color CVar8;
  iterator __result_1;
  const_iterator __position_01;
  _Self __tmp;
  const_iterator __position_02;
  Point destination;
  Point source;
  Point local_b4;
  uint local_b0;
  undefined4 local_ac;
  const_iterator local_a8;
  _Base_ptr local_a0;
  undefined8 local_98;
  _Base_ptr local_90;
  Point local_84;
  _Rb_tree<Point,_std::pair<const_Point,_std::map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>_>,_std::_Select1st<std::pair<const_Point,_std::map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>_>_>_>
  *local_80;
  _Rb_tree<Point,_std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>,_std::_Select1st<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
  *local_78;
  shared_ptr<Piece> local_70;
  _Rb_tree<Point,_std::pair<const_Point,_std::shared_ptr<Piece>_>,_std::_Select1st<std::pair<const_Point,_std::shared_ptr<Piece>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
  local_60;
  
  local_ac = (undefined4)CONCAT71(in_register_00000009,color);
  __position_01._M_node = (possible_moves->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a0 = &(possible_moves->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_b0 = turn;
  local_80 = &possible_play_moves->_M_t;
  local_78 = &possible_moves->_M_t;
  if (__position_01._M_node != local_a0) {
    local_98 = (_Base_ptr *)(CONCAT44(local_98._4_4_,local_ac) & 0xffffffff000000ff);
    do {
      __position_00._M_node = __position_01._M_node[2];
      local_90 = (_Base_ptr)&__position_01._M_node[1]._M_left;
      if (__position_00._M_node != local_90) {
        local_a8._M_node = (_Base_ptr)&__position_01._M_node[1]._M_parent;
        do {
          local_60._M_impl._0_4_ = __position_01._M_node[1]._M_color;
          local_b4 = (Point)__position_00._M_node[1]._M_color;
          lVar1 = *(long *)&(this->m_board).m_data.
                            super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[local_b4.m_x].
                            super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
          ;
          lVar5 = (long)local_b4.m_y * 0x10;
          peVar2 = *(element_type **)(lVar1 + lVar5);
          this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 8 + lVar5);
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
          do_move(this,local_b0,(Point *)&local_60,&local_b4);
          CVar8 = (Color)local_98;
          local_84 = find_king(this,CVar8);
          bVar4 = is_threatened(this,&local_84,CVar8,local_b0,true);
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
          local_70.super___shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
          local_70.super___shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00
          ;
          undo_move(this,(Point *)&local_60,&local_b4,&local_70);
          if (local_70.super___shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_70.super___shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi);
          }
          if (bVar4) {
            __position_00 =
                 std::
                 _Rb_tree<Point,Point,std::_Identity<Point>,std::less<Point>,std::allocator<Point>>
                 ::erase_abi_cxx11_(local_a8._M_node,__position_00._M_node);
          }
          else {
            __position_00._M_node = (_Base_ptr)std::_Rb_tree_increment(__position_00._M_node);
          }
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
        } while (__position_00._M_node != local_90);
      }
      p_Var7 = __position_01._M_node[2]._M_left;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(__position_01._M_node);
      if (p_Var7 == (_Base_ptr)0x0) {
        std::
        _Rb_tree<Point,_std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>,_std::_Select1st<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
        ::_M_erase_aux(local_78,__position_01);
      }
      __position_01._M_node = p_Var6;
    } while (p_Var6 != local_a0);
  }
  p_Var7 = (((_Rep_type *)&local_80->_M_impl)->_M_impl).super__Rb_tree_header._M_header._M_left;
  local_a0 = &(((_Rep_type *)&local_80->_M_impl)->_M_impl).super__Rb_tree_header._M_header;
  if (p_Var7 != local_a0) {
    CVar8 = (Color)local_ac;
    do {
      local_90 = (_Base_ptr)&p_Var7[1]._M_left;
      local_a8._M_node = p_Var7;
      if (*(_Base_ptr *)(p_Var7 + 2) != local_90) {
        local_98 = &p_Var7[1]._M_parent;
        __position_02._M_node = *(_Base_ptr *)(p_Var7 + 2);
        do {
          single_play = &__position_02._M_node[1]._M_parent;
          get_endangered_pieces
                    ((map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
                      *)&local_60,this,(play *)single_play);
          do_move(this,(play *)single_play);
          local_b4 = find_king(this,CVar8);
          bVar4 = is_threatened(this,&local_b4,CVar8,local_b0,true);
          undo_move(this,(map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
                          *)&local_60,(play *)single_play);
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(__position_02._M_node);
          if (bVar4) {
            std::
            _Rb_tree<Point,_std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>,_std::_Select1st<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>
            ::_M_erase_aux((_Rb_tree<Point,_std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>,_std::_Select1st<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>
                            *)local_98,__position_02);
          }
          std::
          _Rb_tree<Point,_std::pair<const_Point,_std::shared_ptr<Piece>_>,_std::_Select1st<std::pair<const_Point,_std::shared_ptr<Piece>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
          ::~_Rb_tree(&local_60);
          __position_02._M_node = p_Var6;
        } while (p_Var6 != local_90);
      }
      __position._M_node = local_a8._M_node;
      p_Var3 = local_a8._M_node[2]._M_left;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(local_a8._M_node);
      if (p_Var3 == (_Base_ptr)0x0) {
        std::
        _Rb_tree<Point,_std::pair<const_Point,_std::map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>_>,_std::_Select1st<std::pair<const_Point,_std::map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>_>_>_>
        ::_M_erase_aux(local_80,__position);
      }
    } while (p_Var7 != local_a0);
  }
  return;
}

Assistant:

void
Board::filter_illegal_moves(map<Point, set<Point>> &possible_moves, map<Point, map<Point, play>> &possible_play_moves,
                            Color color, unsigned int turn) {
    // Filter illegal normal moves.
    for (auto moves = possible_moves.begin(); moves != possible_moves.end();) {
        for (auto move = moves->second.begin(); move != moves->second.end();) {
            auto source = moves->first, destination = *move;
            shared_ptr<Piece> original = m_board[destination];
            do_move(turn, source, destination);
            bool king_threatened = is_threatened(find_king(color), color, turn, true);
            undo_move(source, destination, original);

            if (king_threatened) {
                // Move is illegal.
                move = moves->second.erase(move);
            } else {
                move++;
            }
        }

        if (moves->second.empty()) {
            moves = possible_moves.erase(moves);
        } else {
            moves++;
        }
    }

    // Filter illegal play moves.
    for (auto possible_plays = possible_play_moves.begin(); possible_plays != possible_play_moves.end();) {
        for (auto possible_play = possible_plays->second.begin(); possible_play != possible_plays->second.end();) {
            const auto endangered_pieces = get_endangered_pieces(possible_play->second);
            do_move(possible_play->second);
            const auto king_position = find_king(color);
            bool king_threatened = is_threatened(king_position, color, turn, true);
            undo_move(endangered_pieces, possible_play->second);

            if (king_threatened) {
                // Move is illegal.
                possible_play = possible_plays->second.erase(possible_play);
            } else {
                possible_play++;
            }
        }

        if (possible_plays->second.empty()) {
            possible_plays = possible_play_moves.erase(possible_plays);
        } else {
            possible_plays++;
        }
    }
}